

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

uint __thiscall crnlib::symbol_codec::decode(symbol_codec *this,adaptive_huffman_data_model *model)

{
  uint *puVar1;
  int iVar2;
  decoder_tables *pdVar3;
  unsigned_short *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  uint uVar14;
  
  pdVar3 = model->m_pDecode_tables;
  iVar11 = this->m_bit_count;
  if (iVar11 < 0x18) {
    pbVar8 = this->m_pDecode_buf_next;
    pbVar13 = this->m_pDecode_buf_end;
    do {
      if (pbVar8 == pbVar13) {
        uVar12 = 0;
        if (this->m_decode_buf_eof == false) {
          (*this->m_pDecode_need_bytes_func)
                    ((long)pbVar13 - (long)this->m_pDecode_buf,this->m_pDecode_private_data,
                     &this->m_pDecode_buf,&this->m_decode_buf_size,&this->m_decode_buf_eof);
          pbVar8 = this->m_pDecode_buf;
          pbVar13 = pbVar8 + this->m_decode_buf_size;
          this->m_pDecode_buf_end = pbVar13;
          this->m_pDecode_buf_next = pbVar8;
          if (0 < (long)this->m_decode_buf_size) goto LAB_00195120;
        }
      }
      else {
LAB_00195120:
        this->m_pDecode_buf_next = pbVar8 + 1;
        uVar12 = (uint)*pbVar8;
        pbVar8 = pbVar8 + 1;
      }
      iVar2 = this->m_bit_count;
      iVar11 = iVar2 + 8;
      this->m_bit_count = iVar11;
      uVar12 = uVar12 << (0x18U - (char)iVar2 & 0x1f) | this->m_bit_buf;
      this->m_bit_buf = uVar12;
    } while (iVar2 < 0x10);
  }
  else {
    uVar12 = this->m_bit_buf;
  }
  if (uVar12 >> 0x10 < pdVar3->m_table_max_code) {
    uVar14 = pdVar3->m_lookup[uVar12 >> (-(char)pdVar3->m_table_bits & 0x1fU)] & 0xffff;
    uVar5 = pdVar3->m_lookup[uVar12 >> (-(char)pdVar3->m_table_bits & 0x1fU)] >> 0x10;
  }
  else {
    iVar2 = pdVar3->m_decode_start_code_size - 0x21;
    do {
      iVar6 = iVar2;
      iVar2 = iVar6 + 1;
    } while (pdVar3->m_max_codes[iVar6 + 0x20U] <= uVar12 >> 0x10);
    lVar9 = (long)(int)(uVar12 >> (-(char)(iVar6 + 1) & 0x1fU)) +
            (long)pdVar3->m_val_ptrs[iVar6 + 0x20U];
    if (model->m_total_syms <= (uint)lVar9) {
      return 0;
    }
    uVar5 = iVar6 + 0x21;
    uVar14 = (uint)pdVar3->m_sorted_symbol_order[lVar9];
  }
  this->m_bit_buf = uVar12 << ((byte)uVar5 & 0x1f);
  this->m_bit_count = iVar11 - uVar5;
  puVar4 = (model->m_sym_freq).m_p;
  iVar11 = puVar4[uVar14] + 1;
  puVar4[uVar14] = (unsigned_short)iVar11;
  if (iVar11 == 0xffff) {
    if (model->m_total_syms == 0) {
      uVar7 = 0;
    }
    else {
      uVar10 = 0;
      uVar7 = 0;
      do {
        puVar4 = (model->m_sym_freq).m_p;
        uVar12 = puVar4[uVar10] + 1 >> 1;
        uVar7 = uVar7 + uVar12;
        puVar4[uVar10] = (unsigned_short)uVar12;
        uVar10 = uVar10 + 1;
      } while (uVar10 < model->m_total_syms);
    }
    model->m_total_count = uVar7;
  }
  puVar1 = &model->m_symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    this->m_total_model_updates = this->m_total_model_updates + 1;
    adaptive_huffman_data_model::update(model);
  }
  return uVar14;
}

Assistant:

uint symbol_codec::decode(adaptive_huffman_data_model& model) {
  CRNLIB_ASSERT(m_mode == cDecoding);
  CRNLIB_ASSERT(!model.m_encoding);

  const prefix_coding::decoder_tables* pTables = model.m_pDecode_tables;

  while (m_bit_count < (cBitBufSize - 8)) {
    uint c = 0;
    if (m_pDecode_buf_next == m_pDecode_buf_end) {
      if (!m_decode_buf_eof) {
        m_pDecode_need_bytes_func(m_pDecode_buf_next - m_pDecode_buf, m_pDecode_private_data, m_pDecode_buf, m_decode_buf_size, m_decode_buf_eof);
        m_pDecode_buf_end = m_pDecode_buf + m_decode_buf_size;
        m_pDecode_buf_next = m_pDecode_buf;
        if (m_pDecode_buf_next < m_pDecode_buf_end)
          c = *m_pDecode_buf_next++;
      }
    } else
      c = *m_pDecode_buf_next++;

    m_bit_count += 8;
    m_bit_buf |= (static_cast<bit_buf_t>(c) << (cBitBufSize - m_bit_count));
  }

  uint k = static_cast<uint>((m_bit_buf >> (cBitBufSize - 16)) + 1);
  uint sym, len;

  if (k <= pTables->m_table_max_code) {
    uint32 t = pTables->m_lookup[m_bit_buf >> (cBitBufSize - pTables->m_table_bits)];

    CRNLIB_ASSERT(t != cUINT32_MAX);
    sym = t & cUINT16_MAX;
    len = t >> 16;

    CRNLIB_ASSERT(model.m_code_sizes[sym] == len);
  } else {
    len = pTables->m_decode_start_code_size;

    for (;;) {
      if (k <= pTables->m_max_codes[len - 1])
        break;
      len++;
    }

    int val_ptr = pTables->m_val_ptrs[len - 1] + static_cast<int>((m_bit_buf >> (cBitBufSize - len)));

    if (((uint)val_ptr >= model.m_total_syms)) {
      // corrupted stream, or a bug
      CRNLIB_ASSERT(0);
      return 0;
    }

    sym = pTables->m_sorted_symbol_order[val_ptr];
  }

  m_bit_buf <<= len;
  m_bit_count -= len;

  uint freq = model.m_sym_freq[sym];
  freq++;
  model.m_sym_freq[sym] = static_cast<uint16>(freq);

  if (freq == cUINT16_MAX)
    model.rescale();

  if (--model.m_symbols_until_update == 0) {
    m_total_model_updates++;
    model.update();
  }

  return sym;
}